

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O0

Matrix3d * Vector2Matrix(Vector3d *vec)

{
  Scalar *pSVar1;
  Scalar SVar2;
  Scalar *pSVar3;
  Scalar col;
  Scalar row;
  DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *in_RSI;
  Matrix3d *in_RDI;
  Matrix3d *m;
  EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  *in_stack_ffffffffffffff98;
  Matrix<double,_3,_3,_0,_3,_3> *in_stack_ffffffffffffffa0;
  Index in_stack_ffffffffffffffb0;
  Index in_stack_ffffffffffffffb8;
  
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::Zero();
  Eigen::Matrix<double,3,3,0,3,3>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>>>
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator()
                     (in_RSI,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  SVar2 = -*pSVar1;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)in_RSI,
                      in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  *pSVar3 = SVar2;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator()
                     (in_RSI,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  SVar2 = *pSVar1;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)in_RSI,
                      in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  *pSVar3 = SVar2;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator()
                     (in_RSI,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  SVar2 = *pSVar1;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)in_RSI,
                      in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  *pSVar3 = SVar2;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator()
                     (in_RSI,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  col = -*pSVar1;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)in_RSI,
                      in_stack_ffffffffffffffb8,(Index)col);
  *pSVar3 = col;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator()
                     (in_RSI,in_stack_ffffffffffffffb8,(Index)col);
  row = -*pSVar1;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)in_RSI,(Index)row,
                      (Index)col);
  *pSVar3 = row;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator()
                     (in_RSI,(Index)row,(Index)col);
  SVar2 = *pSVar1;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)in_RSI,(Index)row,
                      (Index)col);
  *pSVar3 = SVar2;
  return in_RDI;
}

Assistant:

Matrix3d Vector2Matrix(Vector3d vec) {
    Matrix3d m = Matrix3d::Zero();
    m(0, 1) = -vec(2, 0);
    m(0, 2) = vec(1, 0);

    m(1, 0) = vec(2, 0);
    m(1, 2) = -vec(0, 0);

    m(2, 0) = -vec(1, 0);
    m(2, 1) = vec(0, 0);

    return m;
}